

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdGetTxOutByHandle(void *handle,void *tx_data_handle,uint32_t index,int64_t *value_satoshi,
                       char **locking_script,char **asset)

{
  bool *pbVar1;
  Script *object;
  ConfidentialTransaction *this;
  int64_t iVar2;
  CfdException *this_00;
  bool is_bitcoin;
  char *work_asset;
  char *work_script;
  string temp_asset;
  Script temp_locking_script;
  TxOutReference ref;
  bool local_201;
  void *local_200;
  char *local_1f8;
  char *local_1f0;
  Amount local_1e8;
  string local_1d8;
  Script local_1b8;
  string local_180;
  Script local_160;
  ConfidentialTxOutReference local_128;
  
  local_1f0 = (char *)0x0;
  local_1f8 = (char *)0x0;
  local_200 = handle;
  cfd::Initialize();
  pbVar1 = &local_128.super_AbstractTxOutReference.value_.ignore_check_;
  local_128.super_AbstractTxOutReference._vptr_AbstractTxOutReference = (_func_int **)pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"TransactionData","");
  cfd::capi::CheckBuffer(tx_data_handle,(string *)&local_128);
  if (local_128.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)pbVar1) {
    operator_delete(local_128.super_AbstractTxOutReference._vptr_AbstractTxOutReference);
  }
  local_201 = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&local_201);
  cfd::core::Amount::Amount(&local_1e8);
  cfd::core::Script::Script(&local_160);
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  this = *(ConfidentialTransaction **)((long)tx_data_handle + 0x18);
  if (this != (ConfidentialTransaction *)0x0) {
    if (local_201 == true) {
      cfd::core::Transaction::GetTxOut((TxOutReference *)&local_128,(Transaction *)this,index);
      object = &local_128.super_AbstractTxOutReference.locking_script_;
      local_1e8.amount_ = local_128.super_AbstractTxOutReference.value_.amount_;
      local_1e8.ignore_check_ = local_128.super_AbstractTxOutReference.value_.ignore_check_;
      cfd::core::Script::Script(&local_1b8,object);
      cfd::core::Script::operator=(&local_160,&local_1b8);
      cfd::core::Script::~Script(&local_1b8);
      local_128.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
           (_func_int **)&PTR__AbstractTxOutReference_007356f0;
      cfd::core::Script::~Script(object);
    }
    else {
      cfd::core::ConfidentialTransaction::GetTxOut(&local_128,this,index);
      local_1e8.amount_ = local_128.super_AbstractTxOutReference.value_.amount_;
      local_1e8.ignore_check_ = local_128.super_AbstractTxOutReference.value_.ignore_check_;
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)&local_1b8,&local_128.asset_);
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                (&local_180,(ConfidentialAssetId *)&local_1b8);
      std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      local_1b8._vptr_Script = (_func_int **)&PTR__ConfidentialAssetId_00735710;
      if (local_1b8.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1b8.script_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_128);
    }
    if (locking_script != (char **)0x0) {
      cfd::core::Script::GetHex_abi_cxx11_((string *)&local_128,&local_160);
      local_1f0 = cfd::capi::CreateString((string *)&local_128);
      if (local_128.super_AbstractTxOutReference._vptr_AbstractTxOutReference !=
          (_func_int **)pbVar1) {
        operator_delete(local_128.super_AbstractTxOutReference._vptr_AbstractTxOutReference);
      }
    }
    if (asset != (char **)0x0) {
      local_1f8 = cfd::capi::CreateString(&local_1d8);
    }
    if (value_satoshi != (int64_t *)0x0) {
      iVar2 = cfd::core::Amount::GetSatoshiValue(&local_1e8);
      *value_satoshi = iVar2;
    }
    if (locking_script != (char **)0x0) {
      *locking_script = local_1f0;
    }
    if (asset != (char **)0x0) {
      *asset = local_1f8;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    cfd::core::Script::~Script(&local_160);
    return 0;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_128.super_AbstractTxOutReference._vptr_AbstractTxOutReference = (_func_int **)pbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,"Invalid handle state. tx is null","");
  cfd::core::CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)&local_128);
  __cxa_throw(this_00,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxOutByHandle(
    void* handle, void* tx_data_handle, uint32_t index, int64_t* value_satoshi,
    char** locking_script, char** asset) {
  int error_code = CfdErrorCode::kCfdUnknownError;
  char* work_script = nullptr;
  char* work_asset = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    Amount temp_value;
    Script temp_locking_script;
    std::string temp_asset;
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      const TxOutReference ref = tx->GetTxOut(index);
      temp_value = ref.GetValue();
      temp_locking_script = ref.GetLockingScript();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      const ConfidentialTxOutReference ref = tx->GetTxOut(index);
      temp_value = ref.GetValue();
      temp_asset = ref.GetAsset().GetHex();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (locking_script != nullptr) {
      work_script = CreateString(temp_locking_script.GetHex());
    }
    if (asset != nullptr) work_asset = CreateString(temp_asset);

    if (value_satoshi != nullptr) {
      *value_satoshi = temp_value.GetSatoshiValue();
    }
    if (locking_script != nullptr) *locking_script = work_script;
    if (asset != nullptr) *asset = work_asset;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    error_code = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_script, &work_asset);
  return error_code;
}